

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__texture1D_enable
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  IErrorHandler *pIVar2;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  texture1D_enable__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  SaxParser *additionalText;
  ParserChar *text;
  undefined8 *puVar3;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL14::texture1D_enable__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
  puVar3 = (undefined8 *)*in_RSI;
  if (puVar3 == (undefined8 *)0x0) {
LAB_0089598e:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            text = (ParserChar *)*puVar3;
            if (text == (ParserChar *)0x0) goto LAB_0089598e;
            attributeHash = GeneratedSaxParser::Utils::calculateStringHash(text);
            if (puVar3 + 1 == (undefined8 *)0x0) {
              return false;
            }
            additionalText = (SaxParser *)puVar3[1];
            puVar3 = puVar3 + 2;
            if (attributeHash != 0x704ac8) break;
            pIVar2 = (IErrorHandler *)
                     GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)(__DT_RELA + 0x169b5));
            (this_00->super_Parser).mErrorHandler = pIVar2;
            if (((in_stack_ffffffffffffffae & 1) != 0) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                                   (StringHash)text,attributeHash,(ParserChar *)additionalText),
               bVar1)) {
              return false;
            }
            if ((in_stack_ffffffffffffffae & 1) == 0) {
              *(uint *)&(this_00->super_Parser)._vptr_Parser =
                   *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
            }
          }
          if (attributeHash != 0x76887d) break;
          (this_00->super_Parser).mSaxParser = additionalText;
        }
        if (attributeHash != 0x7c83b5) break;
        bVar1 = GeneratedSaxParser::Utils::toBool((ParserChar *)0x7c83b5,(bool *)0x895896);
        *(bool *)((long)&(this_00->super_Parser)._vptr_Parser + 4) = bVar1;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                               (StringHash)text,attributeHash,(ParserChar *)additionalText), bVar1))
        {
          return false;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__texture1D_enable( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texture1D_enable( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texture1D_enable__AttributeData* attributeData = newData<texture1D_enable__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toBool(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE1D_ENABLE,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE1D_ENABLE,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE1D_ENABLE,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= texture1D_enable__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURE1D_ENABLE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}